

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# importer.cc
# Opt level: O3

void __thiscall google::protobuf::compiler::DiskSourceTree::~DiskSourceTree(DiskSourceTree *this)

{
  pointer pcVar1;
  
  (this->super_SourceTree)._vptr_SourceTree = (_func_int **)&PTR__DiskSourceTree_004d49b0;
  pcVar1 = (this->last_error_message_)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->last_error_message_).field_2) {
    operator_delete(pcVar1);
  }
  std::
  vector<google::protobuf::compiler::DiskSourceTree::Mapping,_std::allocator<google::protobuf::compiler::DiskSourceTree::Mapping>_>
  ::~vector(&this->mappings_);
  return;
}

Assistant:

DiskSourceTree::~DiskSourceTree() {}